

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse_array(parser *this,lexer *l,size_t nesting_depth)

{
  _func_int **st;
  _Head_base<0UL,_argo::json_*,_false> _Var1;
  token_type tVar2;
  json *this_00;
  token *ptVar3;
  vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
  *pvVar4;
  json_parser_exception *pjVar5;
  string *s;
  size_t sVar6;
  _func_int **in_RCX;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *array;
  _Head_base<0UL,_argo::json_*,_false> local_40;
  _Head_base<0UL,_argo::json_*,_false> local_38;
  
  local_38._M_head_impl = (json *)this;
  if ((l->m_token)._vptr_token < in_RCX) {
    pjVar5 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
    st = (l->m_token)._vptr_token;
    sVar6 = reader::get_byte_index((reader *)l->_vptr_lexer);
    json_parser_exception::json_parser_exception
              (pjVar5,maximum_nesting_depth_exceeded_e,(size_t)st,sVar6);
    __cxa_throw(pjVar5,&json_parser_exception::typeinfo,std::exception::~exception);
  }
  this_00 = (json *)operator_new(0x58);
  json::json(this_00,array_e);
  *(json **)local_38._M_head_impl = this_00;
  ptVar3 = lexer::next((lexer *)nesting_depth);
  tVar2 = token::get_type(ptVar3);
  if (tVar2 != end_array_e) {
    lexer::put_back_last((lexer *)nesting_depth);
    pvVar4 = (vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
              *)json::get_array(this_00);
    parse_value((parser *)&local_40,l,nesting_depth);
    std::
    vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
    ::emplace_back<std::unique_ptr<argo::json,std::default_delete<argo::json>>>
              (pvVar4,(unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_40);
    _Var1._M_head_impl = local_40._M_head_impl;
    if ((reader *)local_40._M_head_impl != (reader *)0x0) {
      json::~json(local_40._M_head_impl);
      operator_delete(_Var1._M_head_impl);
    }
    while( true ) {
      ptVar3 = lexer::next((lexer *)nesting_depth);
      tVar2 = token::get_type(ptVar3);
      if (tVar2 != value_separator_e) break;
      pvVar4 = (vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
                *)json::get_array(this_00);
      parse_value((parser *)&local_40,l,nesting_depth);
      std::
      vector<std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::allocator<std::unique_ptr<argo::json,std::default_delete<argo::json>>>>
      ::emplace_back<std::unique_ptr<argo::json,std::default_delete<argo::json>>>
                (pvVar4,(unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_40);
      _Var1._M_head_impl = local_40._M_head_impl;
      if ((reader *)local_40._M_head_impl != (reader *)0x0) {
        json::~json(local_40._M_head_impl);
        operator_delete(_Var1._M_head_impl);
      }
    }
    tVar2 = token::get_type(ptVar3);
    if (tVar2 != end_array_e) {
      pjVar5 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
      s = token::get_raw_value_abi_cxx11_(ptVar3);
      sVar6 = reader::get_byte_index((reader *)l->_vptr_lexer);
      json_parser_exception::json_parser_exception(pjVar5,unexpected_token_e,s,sVar6);
      __cxa_throw(pjVar5,&json_parser_exception::typeinfo,std::exception::~exception);
    }
  }
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (tuple<argo::json_*,_std::default_delete<argo::json>_>)local_38._M_head_impl;
}

Assistant:

unique_ptr<json> parser::parse_array(lexer &l, size_t nesting_depth)
{
    if (nesting_depth > m_max_nesting_depth)
    {
        throw json_parser_exception(
                            json_parser_exception::maximum_nesting_depth_exceeded_e,
                            m_max_nesting_depth,
                            m_reader.get_byte_index());
    }

    unique_ptr<json> array = unique_ptr<json>(new json(json::array_e));

    const token &t1 = l.next();

    if (t1.get_type() == token::end_array_e)
    {
        return array;
    }
    else
    {
        l.put_back_last();
        array->get_array().push_back(parse_value(l, nesting_depth));
    }

    while (true)
    {
        const token &t2 = l.next();

        if (t2.get_type() == token::value_separator_e)
        {
            array->get_array().push_back(parse_value(l, nesting_depth));
        }
        else if (t2.get_type() == token::end_array_e)
        {
            return array;
        }
        else
        {
            throw json_parser_exception(
                            json_parser_exception::unexpected_token_e,
                            t2.get_raw_value(),
                            m_reader.get_byte_index());
        }
    }
    
    return array;
}